

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O1

TBoard * makeBoard(TBoard *__return_storage_ptr__,short k)

{
  int iVar1;
  undefined6 in_register_00000032;
  
  iVar1 = (int)CONCAT62(in_register_00000032,k);
  __return_storage_ptr__->_M_elems[0]._M_elems[0] = iVar1 % 3;
  __return_storage_ptr__->_M_elems[0]._M_elems[1] = (iVar1 / 3) % 3;
  __return_storage_ptr__->_M_elems[0]._M_elems[2] = (iVar1 / 9) % 3;
  __return_storage_ptr__->_M_elems[1]._M_elems[0] = (iVar1 / 0x1b) % 3;
  __return_storage_ptr__->_M_elems[1]._M_elems[1] = (iVar1 / 0x51) % 3;
  __return_storage_ptr__->_M_elems[1]._M_elems[2] = (iVar1 / 0xf3) % 3;
  __return_storage_ptr__->_M_elems[2]._M_elems[0] = (iVar1 / 0x2d9) % 3;
  __return_storage_ptr__->_M_elems[2]._M_elems[1] = (iVar1 / 0x88b) % 3;
  __return_storage_ptr__->_M_elems[2]._M_elems[2] = (iVar1 / 0x19a1) % 3;
  return __return_storage_ptr__;
}

Assistant:

TBoard
makeBoard(short k)
{
    return {{{{k / g_factors[0] % 3, k / g_factors[1] % 3, k / g_factors[2] % 3}},
             {{k / g_factors[3] % 3, k / g_factors[4] % 3, k / g_factors[5] % 3}},
             {{k / g_factors[6] % 3, k / g_factors[7] % 3, k / g_factors[8] % 3}}}};
}